

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaceOperations.cpp
# Opt level: O3

string * gmlc::networking::getLocalExternalAddressV6_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  pointer pcVar3;
  string *psVar4;
  int iVar5;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var6;
  size_type sVar7;
  int family;
  long lVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  interface_addresses;
  shared_ptr<gmlc::networking::AsioContextManager> srv;
  query query;
  resolver resolver;
  string local_178;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_158;
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_130;
  undefined1 local_118 [48];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8 [2];
  __native_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor> local_80;
  
  local_e8[0]._M_allocated_capacity = 0;
  local_e8[0]._M_local_buf[8] = '\0';
  local_118._40_8_ = local_e8[0]._M_local_buf + 8;
  AsioContextManager::getContextPointer
            ((AsioContextManager *)local_118,(string *)(local_118 + 0x28));
  if ((char *)local_118._40_8_ != local_e8[0]._M_local_buf + 8) {
    operator_delete((void *)local_118._40_8_,
                    CONCAT71(local_e8[0]._9_7_,local_e8[0]._M_local_buf[8]) + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::io_object_impl<asio::io_context>(&local_80,0,0,*(io_context **)(local_118._0_8_ + 0x40));
  local_130.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start._0_4_ = 10;
  asio::ip::host_name_abi_cxx11_();
  local_150._0_8_ = &aStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_150,"");
  asio::ip::basic_resolver_query<asio::ip::tcp>::basic_resolver_query
            ((basic_resolver_query<asio::ip::tcp> *)(local_118 + 0x28),(protocol_type *)&local_130,
             &local_178,(string *)local_150,address_configured);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._0_8_ != &aStack_140) {
    operator_delete((void *)local_150._0_8_,aStack_140._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  asio::ip::basic_resolver<asio::ip::tcp,_asio::any_io_executor>::resolve
            ((results_type *)&local_178,
             (basic_resolver<asio::ip::tcp,_asio::any_io_executor> *)&local_80,
             (query *)(local_118 + 0x28));
  this = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_178._M_string_length;
  sVar7 = *(size_type *)local_178._M_dataplus._M_p;
  lVar8 = CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
          * 0x60;
  local_150._4_4_ = *(undefined4 *)(sVar7 + 4 + lVar8);
  psVar2 = (size_type *)(sVar7 + 8 + lVar8);
  local_118._16_8_ = *psVar2;
  local_118._24_8_ = psVar2[1];
  psVar4 = (string *)local_150;
  local_150[0] = *(short *)(sVar7 + lVar8) != 2;
  if ((bool)local_150[0]) {
    aStack_140._8_4_ = *(undefined4 *)(sVar7 + 0x18 + lVar8);
    local_150._4_4_ = 0;
    local_150._8_8_ = local_118._16_8_;
    aStack_140._M_allocated_capacity = local_118._24_8_;
  }
  else {
    local_150._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    aStack_140._M_allocated_capacity = 0;
    aStack_140._8_4_ = 0;
  }
  local_150._1_3_ = 0;
  asio::ip::address::to_string_abi_cxx11_(&local_178,(address *)local_150);
  netif::getInterfaceAddresses_abi_cxx11_(&local_130,(netif *)0xa,family);
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
      CONCAT44(local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._4_4_,
               local_130.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start._0_4_) ==
      local_130.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_178._M_string_length;
  }
  else {
    _Var6 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(local_130.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_130.
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_4_),
                       local_130.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish,&local_178);
    if (_Var6._M_current ==
        local_130.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_158 = this;
      local_150._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      aStack_140._M_allocated_capacity = aStack_140._M_allocated_capacity & 0xffffffffffffff00;
      pbVar10 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                CONCAT44(local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,
                         local_130.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_4_);
      local_150._0_8_ = &aStack_140;
      if (pbVar10 == _Var6._M_current) {
LAB_00406d0b:
        (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
        paVar9 = &local_178.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_178._M_dataplus._M_p == paVar9) {
          (in_RDI->field_2)._M_allocated_capacity =
               CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                        local_178.field_2._M_local_buf[0]);
          *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
        }
        else {
          (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
          (in_RDI->field_2)._M_allocated_capacity =
               CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                        local_178.field_2._M_local_buf[0]);
        }
        psVar4 = &local_178;
        in_RDI->_M_string_length = local_178._M_string_length;
        local_178._M_dataplus._M_p = (pointer)paVar9;
      }
      else {
        paVar1 = &in_RDI->field_2;
        do {
          (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char*>();
          iVar5 = CLI::std::__cxx11::
                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                            (in_RDI,"::1");
          if (iVar5 != 0) {
            sVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                    ::rfind((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_RDI,"fe80:",0,5);
            if (sVar7 != 0) goto LAB_00406d61;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_150,in_RDI);
            }
          }
          pcVar3 = (in_RDI->_M_dataplus)._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar3 != paVar1) {
            operator_delete(pcVar3,paVar1->_M_allocated_capacity + 1);
          }
          pbVar10 = pbVar10 + 1;
        } while (pbVar10 != _Var6._M_current);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_150._8_8_ ==
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) goto LAB_00406d0b;
        (in_RDI->_M_dataplus)._M_p = (pointer)paVar1;
        paVar9 = &aStack_140;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._0_8_ == paVar9) {
          paVar1->_M_allocated_capacity = aStack_140._M_allocated_capacity;
          *(ulong *)((long)&in_RDI->field_2 + 8) = CONCAT44(aStack_140._12_4_,aStack_140._8_4_);
        }
        else {
          (in_RDI->_M_dataplus)._M_p = (pointer)local_150._0_8_;
          (in_RDI->field_2)._M_allocated_capacity = aStack_140._M_allocated_capacity;
        }
        in_RDI->_M_string_length = local_150._8_8_;
        local_150._0_8_ = paVar9;
      }
      psVar4->_M_string_length = 0;
      paVar9->_M_local_buf[0] = '\0';
LAB_00406d61:
      this = local_158;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._0_8_ != &aStack_140) {
        operator_delete((void *)local_150._0_8_,aStack_140._M_allocated_capacity + 1);
        this = local_158;
      }
      goto LAB_00406d82;
    }
    (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_178._M_dataplus._M_p == &local_178.field_2) {
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
      *(undefined8 *)((long)&in_RDI->field_2 + 8) = local_178.field_2._8_8_;
    }
    else {
      (in_RDI->_M_dataplus)._M_p = local_178._M_dataplus._M_p;
      (in_RDI->field_2)._M_allocated_capacity =
           CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,local_178.field_2._M_local_buf[0])
      ;
    }
    in_RDI->_M_string_length = local_178._M_string_length;
  }
  local_178._M_dataplus._M_p = (pointer)&local_178.field_2;
  local_178._M_string_length = 0;
  local_178.field_2._M_local_buf[0] = '\0';
LAB_00406d82:
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_178._M_dataplus._M_p != &local_178.field_2) {
    operator_delete(local_178._M_dataplus._M_p,
                    CONCAT71(local_178.field_2._M_allocated_capacity._1_7_,
                             local_178.field_2._M_local_buf[0]) + 1);
  }
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.__data.__list.__next != &local_90) {
    operator_delete(local_c0.__data.__list.__next,(ulong)(local_90._M_allocated_capacity + 1));
  }
  if ((char *)local_c0.__align != local_c0.__size + 0x10) {
    operator_delete((void *)local_c0.__align,local_c0._16_8_ + 1);
  }
  asio::detail::io_object_impl<asio::detail::resolver_service<asio::ip::tcp>,_asio::any_io_executor>
  ::~io_object_impl(&local_80);
  if ((element_type *)local_118._8_8_ != (element_type *)0x0) {
    CLI::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
  }
  return (string *)in_RDI;
}

Assistant:

std::string getLocalExternalAddressV6()
{
#ifndef GMLC_NETWORKING_DISABLE_ASIO
    auto srv = gmlc::networking::AsioContextManager::getContextPointer();

    asio::ip::tcp::resolver resolver(srv->getBaseContext());
    asio::ip::tcp::resolver::query query(
        asio::ip::tcp::v6(), asio::ip::host_name(), "");
    asio::ip::tcp::resolver::iterator it = resolver.resolve(query);
    asio::ip::tcp::endpoint endpoint = *it;

    auto resolved_address = endpoint.address().to_string();
#else
    std::string resolved_address;
#endif
    auto interface_addresses = gmlc::netif::getInterfaceAddressesV6();

    // Return the resolved address if no interface addresses were found
    if (interface_addresses.empty()) {
        return resolved_address;
    }

    // Use the resolved address if it matches one of the interface addresses
    if (std::find(
            interface_addresses.begin(),
            interface_addresses.end(),
            resolved_address) != interface_addresses.end()) {
        return resolved_address;
    }

    // Pick an interface that isn't the IPv6 loopback address, ::1/128
    // or an IPv6 link-local address, fe80::/16
    std::string link_local_addr;
    for (auto addr : interface_addresses) {
        if (addr != "::1") {
            if (addr.rfind("fe80:", 0) != 0) {
                return addr;
            }
            if (link_local_addr.empty()) {
                link_local_addr = addr;
            }
        }
    }

    // No other choices, so return a link local address if one was found
    if (!link_local_addr.empty()) {
        return link_local_addr;
    }

    // Very likely that any address returned at this point won't be a working
    // external address
    return resolved_address;
}